

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::DeepTiledInputFile::Data::~Data(Data *this)

{
  pointer ppTVar1;
  TileBuffer *this_00;
  long *plVar2;
  pointer ppTVar3;
  size_t i;
  ulong uVar4;
  size_t i_1;
  
  if (this->numXTiles != (int *)0x0) {
    operator_delete__(this->numXTiles);
  }
  if (this->numYTiles != (int *)0x0) {
    operator_delete__(this->numYTiles);
  }
  uVar4 = 0;
  while( true ) {
    ppTVar1 = (this->tileBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->tileBuffers).
                      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <= uVar4)
    break;
    this_00 = ppTVar1[uVar4];
    if (this_00 != (TileBuffer *)0x0) {
      plVar2 = *(long **)&(this_00->exception)._M_dataplus;
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
      }
      IlmThread_2_5::Semaphore::~Semaphore((Semaphore *)&this_00->field_0x78);
      std::__cxx11::string::~string((string *)&this_00->_sem);
      Array2D<unsigned_int>::~Array2D((Array2D<unsigned_int> *)this_00);
    }
    operator_delete(this_00,0xa0);
    uVar4 = uVar4 + 1;
  }
  if ((this->multiPartBackwardSupport != false) &&
     (this->multiPartFile != (MultiPartInputFile *)0x0)) {
    (*(this->multiPartFile->super_GenericInputFile)._vptr_GenericInputFile[1])();
  }
  uVar4 = 0;
  while( true ) {
    ppTVar3 = (this->slices).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->slices).
                      super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3) <= uVar4)
    break;
    operator_delete(ppTVar3[uVar4],0x40);
    uVar4 = uVar4 + 1;
  }
  if (this->sampleCountTableComp != (Compressor *)0x0) {
    (*this->sampleCountTableComp->_vptr_Compressor[1])();
  }
  Array<char>::~Array(&this->sampleCountTableBuffer);
  std::
  vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ::~vector(&this->tileBuffers);
  std::
  vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
  ::~vector(&this->slices);
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::~vector(&(this->tileOffsets)._offsets);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
               *)&this->frameBuffer);
  Header::~Header(&this->header);
  return;
}

Assistant:

DeepTiledInputFile::Data::~Data ()
{
    delete [] numXTiles;
    delete [] numYTiles;

    for (size_t i = 0; i < tileBuffers.size(); i++)
        delete tileBuffers[i];

    if (multiPartBackwardSupport)
        delete multiPartFile;

    for (size_t i = 0; i < slices.size(); i++)
        delete slices[i];

    delete sampleCountTableComp;
}